

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O3

void sx_coro_destroy_context(sx_coro_context *ctx)

{
  int iVar1;
  sx_alloc *psVar2;
  code *pcVar3;
  sx__pool_page *psVar4;
  sx__pool_page *psVar5;
  int iVar6;
  long lVar7;
  sx_pool *psVar8;
  
  if (ctx == (sx_coro_context *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",
                      0xc2,"ctx");
    pcVar3 = (code *)swi(3);
    (*pcVar3)();
    return;
  }
  psVar8 = ctx->coro_pool;
  if (psVar8 == (sx_pool *)0x0) {
    return;
  }
  psVar2 = ctx->alloc;
  psVar4 = psVar8->pages;
  if (psVar4 != (sx__pool_page *)0x0) {
    iVar1 = psVar8->capacity;
    do {
      iVar6 = psVar4->iter;
      lVar7 = (long)iVar6;
      if (iVar6 < iVar1) {
        iVar6 = iVar1 - iVar6;
        do {
          if (*(char *)((long)psVar4->ptrs[lVar7] + 0x48) == '\x01') {
            sx_fiber_stack_release((sx_fiber_stack *)((long)psVar4->ptrs[lVar7] + 8));
          }
          lVar7 = lVar7 + 1;
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      psVar4 = psVar4->next;
    } while (psVar4 != (sx__pool_page *)0x0);
    psVar8 = ctx->coro_pool;
    if (psVar8 == (sx_pool *)0x0) goto LAB_00109c8d;
  }
  psVar4 = psVar8->pages;
  if (psVar4 == (sx__pool_page *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h"
                      ,0x77,"pool->pages");
    pcVar3 = (code *)swi(3);
    (*pcVar3)();
    return;
  }
  psVar5 = psVar4->next;
  if (psVar4->next != (sx__pool_page *)0x0) {
    do {
      psVar4 = psVar5->next;
      (*psVar2->alloc_cb)(psVar5,0,0x10,(char *)0x0,(char *)0x0,0,psVar2->user_data);
      psVar5 = psVar4;
    } while (psVar4 != (sx__pool_page *)0x0);
    psVar4 = psVar8->pages;
  }
  psVar8->capacity = 0;
  psVar4->iter = 0;
  psVar4->next = (sx__pool_page *)0x0;
  (*psVar2->alloc_cb)(psVar8,0,0x10,(char *)0x0,(char *)0x0,0,psVar2->user_data);
LAB_00109c8d:
  (*psVar2->alloc_cb)(ctx,0,0,(char *)0x0,(char *)0x0,0,psVar2->user_data);
  return;
}

Assistant:

void sx_coro_destroy_context(sx_coro_context* ctx)
{
    sx_assert(ctx);

    const sx_alloc* alloc = ctx->alloc;
    if (ctx->coro_pool) {
        // TODO: release fiber's stack memory
        sx__pool_page* page = ctx->coro_pool->pages;
        int capacity = ctx->coro_pool->capacity;
        while (page) {
            for (int i = page->iter; i < capacity; i++) {
                sx__coro_state* state = page->ptrs[i];
                if (state->init) {
                    sx_fiber_stack_release(&state->stack_mem);
                }
            }
            page = page->next;
        }

        sx_pool_destroy(ctx->coro_pool, alloc);
        sx_free(alloc, ctx);
    }
}